

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzplane.cpp
# Opt level: O0

bool __thiscall TPZPlane::Belongs(TPZPlane *this,TPZVec<double> *ponto)

{
  double dVar1;
  double *pdVar2;
  TPZVec<double> *in_RSI;
  TPZVec<double> *in_RDI;
  int i;
  REAL aux;
  int local_24;
  double local_20;
  
  local_20 = 0.0;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    pdVar2 = TPZVec<double>::operator[](in_RSI,(long)local_24);
    dVar1 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](in_RDI,(long)local_24);
    local_20 = dVar1 * *pdVar2 + local_20;
  }
  pdVar2 = TPZVec<double>::operator[](in_RDI,3);
  return ABS(local_20 + *pdVar2) < 9e-06;
}

Assistant:

bool TPZPlane::Belongs(const TPZVec<REAL> &ponto){
	REAL aux=0.0;
	int i;
	
	for(i=0;i<3;i++){
		aux = aux + ponto[i]*fCoef[i];
	}
	aux = aux + fCoef[3];
	if(fabs(aux)<0.000009) {
		return true;
	}
	else return false;
}